

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

bool __thiscall glcts::LayoutBindingProgram::compiledAndLinked(LayoutBindingProgram *this)

{
  int iVar1;
  ShaderInfo *pSVar2;
  ProgramInfo *pPVar3;
  byte local_22;
  byte local_21;
  LayoutBindingProgram *this_local;
  
  iVar1 = (*this->_vptr_LayoutBindingProgram[2])();
  if (iVar1 == 2) {
    pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_COMPUTE,0);
    local_22 = 0;
    if ((pSVar2->compileOk & 1U) != 0) {
      pPVar3 = glu::ShaderProgram::getProgramInfo(this->m_program);
      local_22 = pPVar3->linkOk;
    }
  }
  else {
    pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_FRAGMENT,0);
    local_21 = 0;
    local_22 = local_21;
    if ((pSVar2->compileOk & 1U) != 0) {
      pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_FRAGMENT,0);
      local_21 = 0;
      local_22 = local_21;
      if ((pSVar2->compileOk & 1U) != 0) {
        pPVar3 = glu::ShaderProgram::getProgramInfo(this->m_program);
        local_22 = pPVar3->linkOk;
      }
    }
  }
  this_local._7_1_ = (bool)(local_22 & 1);
  return this_local._7_1_;
}

Assistant:

bool compiledAndLinked() const
	{
		if (getStage() != ComputeShader)
			return m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk &&
				   m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk && m_program->getProgramInfo().linkOk;

		return m_program->getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk && m_program->getProgramInfo().linkOk;
	}